

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O2

void duckdb::FindForeignKeyIndexes
               (ColumnList *columns,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,vector<duckdb::PhysicalIndex,_true> *indexes)

{
  pointer pbVar1;
  bool bVar2;
  ColumnDefinition *this;
  BinderException *pBVar3;
  string *psVar4;
  pointer name;
  allocator local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  name = (names->
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (names->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (name == pbVar1) {
      return;
    }
    bVar2 = ColumnList::ColumnExists(columns,name);
    if (!bVar2) break;
    this = ColumnList::GetColumn(columns,name);
    bVar2 = ColumnDefinition::Generated(this);
    if (bVar2) {
      pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_90,
                 "Failed to create foreign key: referenced column \"%s\" is a generated column",
                 &local_91);
      psVar4 = ColumnDefinition::Name_abi_cxx11_(this);
      ::std::__cxx11::string::string((string *)&local_70,(string *)psVar4);
      BinderException::BinderException<std::__cxx11::string>(pBVar3,&local_90,&local_70);
      __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_90._M_dataplus._M_p = (pointer)ColumnDefinition::Physical(this);
    ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::
    emplace_back<duckdb::PhysicalIndex>
              (&indexes->super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
               ,(PhysicalIndex *)&local_90);
    name = name + 1;
  }
  pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_90,"column \"%s\" named in key does not exist",&local_91);
  ::std::__cxx11::string::string((string *)&local_50,(string *)name);
  BinderException::BinderException<std::__cxx11::string>(pBVar3,&local_90,&local_50);
  __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void FindForeignKeyIndexes(const ColumnList &columns, const vector<string> &names,
                                  vector<PhysicalIndex> &indexes) {
	D_ASSERT(indexes.empty());
	D_ASSERT(!names.empty());
	for (auto &name : names) {
		if (!columns.ColumnExists(name)) {
			throw BinderException("column \"%s\" named in key does not exist", name);
		}
		auto &column = columns.GetColumn(name);
		if (column.Generated()) {
			throw BinderException("Failed to create foreign key: referenced column \"%s\" is a generated column",
			                      column.Name());
		}
		indexes.push_back(column.Physical());
	}
}